

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred.c
# Opt level: O0

void dc_left_predictor(uint8_t *dst,ptrdiff_t stride,int bw,int bh,uint8_t *above,uint8_t *left)

{
  int in_ECX;
  int in_EDX;
  long in_RSI;
  void *in_RDI;
  long in_R9;
  int sum;
  int expected_dc;
  int r;
  int i;
  undefined4 local_38;
  undefined4 local_30;
  undefined4 local_2c;
  undefined8 local_8;
  
  local_38 = 0;
  for (local_2c = 0; local_2c < in_ECX; local_2c = local_2c + 1) {
    local_38 = (uint)*(byte *)(in_R9 + local_2c) + local_38;
  }
  local_8 = in_RDI;
  for (local_30 = 0; local_30 < in_ECX; local_30 = local_30 + 1) {
    memset(local_8,(local_38 + (in_ECX >> 1)) / in_ECX & 0xff,(long)in_EDX);
    local_8 = (void *)(in_RSI + (long)local_8);
  }
  return;
}

Assistant:

static inline void dc_left_predictor(uint8_t *dst, ptrdiff_t stride, int bw,
                                     int bh, const uint8_t *above,
                                     const uint8_t *left) {
  int i, r, expected_dc, sum = 0;
  (void)above;

  for (i = 0; i < bh; i++) sum += left[i];
  expected_dc = (sum + (bh >> 1)) / bh;

  for (r = 0; r < bh; r++) {
    memset(dst, expected_dc, bw);
    dst += stride;
  }
}